

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O0

void __thiscall camp::ArrayProperty::resize(ArrayProperty *this,UserObject *object,size_t newSize)

{
  bool bVar1;
  ForbiddenWrite *pFVar2;
  string *psVar3;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  ForbiddenWrite local_110;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [48];
  ForbiddenWrite local_68;
  size_t local_20;
  size_t newSize_local;
  UserObject *object_local;
  ArrayProperty *this_local;
  
  local_20 = newSize;
  newSize_local = (size_t)object;
  object_local = (UserObject *)this;
  bVar1 = dynamic(this);
  if (!bVar1) {
    local_c2 = 1;
    pFVar2 = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
    psVar3 = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenWrite::ForbiddenWrite(&local_68,psVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"void camp::ArrayProperty::resize(const UserObject &, std::size_t) const",
               &local_c1);
    Error::prepare<camp::ForbiddenWrite>
              (pFVar2,&local_68,(string *)local_98,0x4e,(string *)local_c0);
    local_c2 = 0;
    __cxa_throw(pFVar2,&ForbiddenWrite::typeinfo,ForbiddenWrite::~ForbiddenWrite);
  }
  bVar1 = Property::writable(&this->super_Property,(UserObject *)newSize_local);
  if (!bVar1) {
    pFVar2 = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
    psVar3 = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenWrite::ForbiddenWrite(&local_110,psVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_158,"void camp::ArrayProperty::resize(const UserObject &, std::size_t) const",
               &local_159);
    Error::prepare<camp::ForbiddenWrite>
              (pFVar2,&local_110,(string *)local_130,0x52,(string *)local_158);
    __cxa_throw(pFVar2,&ForbiddenWrite::typeinfo,ForbiddenWrite::~ForbiddenWrite);
  }
  (*(this->super_Property).super_TagHolder._vptr_TagHolder[8])(this,newSize_local,local_20);
  return;
}

Assistant:

void ArrayProperty::resize(const UserObject& object, std::size_t newSize) const
{
    // Check if the array is dynamic
    if (!dynamic())
        CAMP_ERROR(ForbiddenWrite(name()));

    // Check if the property is writable
    if (!writable(object))
        CAMP_ERROR(ForbiddenWrite(name()));

    setSize(object, newSize);
}